

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::writeReport(CLIntercept *this,ostream *os)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_00;
  bool bVar1;
  _Setw _Var2;
  _Setprecision _Var3;
  SConfig *pSVar4;
  ostream *poVar5;
  void *pvVar6;
  atomic<unsigned_long> *paVar7;
  pointer pvVar8;
  reference pvVar9;
  reference ppVar10;
  reference pvVar11;
  ulong uVar12;
  unsigned_long *puVar13;
  reference pbVar14;
  mapped_type *pmVar15;
  ostream *in_RSI;
  CLIntercept *in_RDI;
  SDeviceTimingStats *deviceTimingStats_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_3;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  SDeviceTimingStats *deviceTimingStats;
  string *name_2;
  const_iterator i_2;
  size_t longestName_1;
  cl_ulong totalTotalNS_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_1;
  SDeviceInfo *deviceInfo;
  CDeviceTimingStatsMap *dtsm;
  cl_device_id device;
  const_iterator id;
  SHostTimingStats *hostTimingStats_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  SHostTimingStats *hostTimingStats;
  string *name;
  const_iterator i_1;
  size_t longestName;
  uint64_t totalTotalNS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  const_iterator i;
  memory_order __b;
  key_type *in_stack_fffffffffffff838;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
  *in_stack_fffffffffffff840;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  _Setw in_stack_fffffffffffff854;
  ostream *in_stack_fffffffffffff868;
  ostream *in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff878;
  _Setw in_stack_fffffffffffff87c;
  ostream *in_stack_fffffffffffff880;
  float local_734;
  float local_72c;
  ostream *in_stack_fffffffffffff9c8;
  CLIntercept *in_stack_fffffffffffff9d0;
  ostream *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  float local_494;
  float local_48c;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  undefined1 *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  unsigned_long local_1b8;
  SDeviceTimingStats *local_1b0;
  reference local_1a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_true>
  local_1a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_true>
  local_198;
  unsigned_long local_190;
  ulong local_188;
  undefined1 local_180 [24];
  mapped_type *local_168;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
  *local_160;
  _cl_device_id *local_158;
  iterator local_150;
  _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
  local_148;
  iterator local_140;
  _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
  local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  mapped_type *local_110;
  reference local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  undefined1 *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  unsigned_long local_b8;
  SHostTimingStats *local_b0;
  reference local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_true>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_true>
  local_98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_true>
  local_90;
  unsigned_long local_88;
  ulong local_80;
  undefined1 local_68 [24];
  int local_50;
  int local_4c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  int local_30;
  int local_2c;
  ostream *local_28;
  ulong local_18;
  memory_order local_10;
  int local_c;
  atomic<unsigned_long> *local_8;
  
  local_28 = in_RSI;
  pSVar4 = config(in_RDI);
  if ((pSVar4->FinishAfterEnqueue & 1U) != 0) {
    poVar5 = std::operator<<(local_28,"*** WARNING *** FinishAfterEnqueue Enabled!");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  pSVar4 = config(in_RDI);
  if ((pSVar4->FlushAfterEnqueue & 1U) != 0) {
    poVar5 = std::operator<<(local_28,"*** WARNING *** FlushAfterEnqueue Enabled!");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  pSVar4 = config(in_RDI);
  if ((pSVar4->NullEnqueue & 1U) != 0) {
    poVar5 = std::operator<<(local_28,"*** WARNING *** NullEnqueue Enabled!");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<(local_28,"Total Enqueues: ");
  paVar7 = &in_RDI->m_EnqueueCounter;
  local_c = 0;
  local_8 = paVar7;
  local_10 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_18 = (paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_c == 5) {
    local_18 = (paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_18 = (paVar7->super___atomic_base<unsigned_long>)._M_i;
  }
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_18);
  pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  pSVar4 = config(in_RDI);
  if ((pSVar4->LeakChecking & 1U) != 0) {
    poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Leak Checking:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    CObjectTracker::writeReport
              ((CObjectTracker *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58);
  }
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1eaf23);
  if (!bVar1) {
    poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Kernel name mapping:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::right);
    local_2c = (int)std::setw(10);
    poVar5 = std::operator<<(poVar5,(_Setw)local_2c);
    poVar5 = std::operator<<(poVar5,"Short Name");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_30 = (int)std::setw(1);
    poVar5 = std::operator<<(poVar5,(_Setw)local_30);
    poVar5 = std::operator<<(poVar5,"Long Name");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff838);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                *)in_stack_fffffffffffff840,
               (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                *)in_stack_fffffffffffff838);
    while( true ) {
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff838);
      bVar1 = std::__detail::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      poVar5 = (ostream *)std::ostream::operator<<(local_28,std::right);
      local_4c = (int)std::setw(10);
      poVar5 = std::operator<<(poVar5,(_Setw)local_4c);
      pvVar8 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)0x1eb0e6);
      poVar5 = std::operator<<(poVar5,(string *)&pvVar8->second);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_50 = (int)std::setw(1);
      poVar5 = std::operator<<(poVar5,(_Setw)local_50);
      pvVar8 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)0x1eb15a);
      poVar5 = std::operator<<(poVar5,(string *)pvVar8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)in_stack_fffffffffffff840);
    }
  }
  pSVar4 = config(in_RDI);
  if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
     (bVar1 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
              ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
                       *)0x1eb1b8), !bVar1)) {
    poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Host Performance Timing Results:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1eb210);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
    ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
            *)0x1eb224);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff870,(size_type)in_stack_fffffffffffff868);
    local_80 = 0;
    local_88 = 0x20;
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
                  *)in_stack_fffffffffffff838);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                *)in_stack_fffffffffffff840,
               (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                *)in_stack_fffffffffffff838);
    while( true ) {
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
                  *)in_stack_fffffffffffff838);
      bVar1 = std::__detail::operator!=(&local_90,&local_a0);
      if (!bVar1) break;
      local_a8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                 ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                              *)0x1eb2c6);
      pvVar9 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                            *)0x1eb2db);
      local_b0 = &pvVar9->second;
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff854._M_n,in_stack_fffffffffffff850),
                    in_stack_fffffffffffff848._M_current);
        local_80 = local_80 + local_b0->TotalNS;
        local_b8 = std::__cxx11::string::length();
        puVar13 = std::max<unsigned_long>(&local_b8,&local_88);
        local_88 = *puVar13;
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_false,_true>
                    *)in_stack_fffffffffffff840);
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff838);
    local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff838);
    __first._M_current._4_4_ = in_stack_fffffffffffff854._M_n;
    __first._M_current._0_4_ = in_stack_fffffffffffff850;
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (__first,in_stack_fffffffffffff848);
    poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Total Time (ns): ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,local_80);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pvVar6 = (void *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::right);
    local_cc = (int)std::setw((int)local_88);
    poVar5 = std::operator<<(poVar5,(_Setw)local_cc);
    poVar5 = std::operator<<(poVar5,"Function Name");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_d0 = (int)std::setw(6);
    poVar5 = std::operator<<(poVar5,(_Setw)local_d0);
    poVar5 = std::operator<<(poVar5,"Calls");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_d4 = (int)std::setw(0xd);
    poVar5 = std::operator<<(poVar5,(_Setw)local_d4);
    poVar5 = std::operator<<(poVar5,"Time (ns)");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_d8 = (int)std::setw(8);
    poVar5 = std::operator<<(poVar5,(_Setw)local_d8);
    poVar5 = std::operator<<(poVar5,"Time (%)");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_dc = (int)std::setw(0xd);
    poVar5 = std::operator<<(poVar5,(_Setw)local_dc);
    poVar5 = std::operator<<(poVar5,"Average (ns)");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_e0 = (int)std::setw(0xd);
    poVar5 = std::operator<<(poVar5,(_Setw)local_e0);
    poVar5 = std::operator<<(poVar5,"Min (ns)");
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
    local_e4 = (int)std::setw(0xd);
    poVar5 = std::operator<<(poVar5,(_Setw)local_e4);
    poVar5 = std::operator<<(poVar5,"Max (ns)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_f0 = local_68;
    local_f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff838);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff838);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff840,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff838), bVar1) {
      local_108 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_f8);
      local_110 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
                  ::at(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      poVar5 = (ostream *)std::ostream::operator<<(local_28,std::right);
      local_114 = (int)std::setw((int)local_88);
      poVar5 = std::operator<<(poVar5,(_Setw)local_114);
      poVar5 = std::operator<<(poVar5,(string *)local_108);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_118 = (int)std::setw(6);
      poVar5 = std::operator<<(poVar5,(_Setw)local_118);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_110->NumberOfCalls);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_11c = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_11c);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_110->TotalNS);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_120 = (int)std::setw(7);
      poVar5 = std::operator<<(poVar5,(_Setw)local_120);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
      local_124 = (int)std::setprecision(2);
      poVar5 = std::operator<<(poVar5,(_Setprecision)local_124);
      local_48c = (float)local_110->TotalNS;
      local_494 = (float)local_80;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_48c * 100.0) / local_494);
      poVar5 = std::operator<<(poVar5,"%, ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_128 = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_128);
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,local_110->TotalNS / local_110->NumberOfCalls);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_12c = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_12c);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_110->MinNS);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_130 = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_130);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_110->MaxNS);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_f8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff854._M_n,in_stack_fffffffffffff850));
  }
  pSVar4 = config(in_RDI);
  if (((pSVar4->DevicePerformanceTiming & 1U) != 0) &&
     (bVar1 = std::
              map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
              ::empty((map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
                       *)0x1ebf18), !bVar1)) {
    local_140._M_node =
         (_Base_ptr)
         std::
         map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
         ::begin((map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
                  *)in_stack_fffffffffffff838);
    std::
    _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_138,&local_140);
    while( true ) {
      local_150._M_node =
           (_Base_ptr)
           std::
           map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
           ::end((map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
                  *)in_stack_fffffffffffff838);
      std::
      _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_148,&local_150);
      bVar1 = std::operator!=(&local_138,&local_148);
      if (!bVar1) break;
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
                ::operator*((_Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
                             *)in_stack_fffffffffffff840);
      local_158 = ppVar10->first;
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
                ::operator*((_Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
                             *)in_stack_fffffffffffff840);
      local_160 = &ppVar10->second;
      local_168 = std::
                  map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                  ::operator[]((map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                                *)in_stack_fffffffffffff880,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffff87c._M_n,in_stack_fffffffffffff878));
      poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"Device Performance Timing Results for ");
      poVar5 = std::operator<<(poVar5,(string *)&local_168->NameForReport);
      poVar5 = std::operator<<(poVar5,":");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1ec070);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
      ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
              *)0x1ec07d);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff870,(size_type)in_stack_fffffffffffff868);
      local_188 = 0;
      local_190 = 0x20;
      local_198._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                    *)in_stack_fffffffffffff838);
      while( true ) {
        local_1a0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                    *)in_stack_fffffffffffff838);
        bVar1 = std::__detail::operator!=(&local_198,&local_1a0);
        if (!bVar1) break;
        local_1a8 = std::__detail::
                    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
                    ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
                                 *)0x1ec0fc);
        pvVar11 = std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
                  ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
                               *)0x1ec111);
        local_1b0 = &pvVar11->second;
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff854._M_n,in_stack_fffffffffffff850),
                      in_stack_fffffffffffff848._M_current);
          local_188 = local_188 + local_1b0->TotalNS;
          local_1b8 = std::__cxx11::string::length();
          puVar13 = std::max<unsigned_long>(&local_1b8,&local_190);
          local_190 = *puVar13;
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_false,_true>
                      *)in_stack_fffffffffffff840);
      }
      local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff838);
      local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff838);
      __first_00._M_current._4_4_ = in_stack_fffffffffffff854._M_n;
      __first_00._M_current._0_4_ = in_stack_fffffffffffff850;
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (__first_00,in_stack_fffffffffffff848);
      poVar5 = (ostream *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"Total Time (ns): ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_188);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      pvVar6 = (void *)std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
      poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::right);
      local_1cc = (int)std::setw((int)local_190);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1cc);
      poVar5 = std::operator<<(poVar5,"Function Name");
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_1d0 = (int)std::setw(6);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1d0);
      poVar5 = std::operator<<(poVar5,"Calls");
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_1d4 = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1d4);
      poVar5 = std::operator<<(poVar5,"Time (ns)");
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_1d8 = (int)std::setw(8);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1d8);
      poVar5 = std::operator<<(poVar5,"Time (%)");
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_1dc = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1dc);
      poVar5 = std::operator<<(poVar5,"Average (ns)");
      in_stack_fffffffffffff9d0 = (CLIntercept *)std::operator<<(poVar5,", ");
      in_stack_fffffffffffff9c8 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9d0,std::right);
      local_1e0 = (int)std::setw(0xd);
      poVar5 = std::operator<<(in_stack_fffffffffffff9c8,(_Setw)local_1e0);
      poVar5 = std::operator<<(poVar5,"Min (ns)");
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
      local_1e4 = (int)std::setw(0xd);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1e4);
      poVar5 = std::operator<<(poVar5,"Max (ns)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1f0 = local_180;
      local_1f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff838);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff838);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff840,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff838), bVar1) {
        pbVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1f8);
        pmVar15 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                        *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        poVar5 = (ostream *)std::ostream::operator<<(local_28,std::right);
        _Var2 = std::setw((int)local_190);
        poVar5 = std::operator<<(poVar5,_Var2);
        poVar5 = std::operator<<(poVar5,(string *)pbVar14);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        _Var2 = std::setw(6);
        poVar5 = std::operator<<(poVar5,_Var2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pmVar15->NumberOfCalls);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        _Var2 = std::setw(0xd);
        poVar5 = std::operator<<(poVar5,_Var2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pmVar15->TotalNS);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        _Var2 = std::setw(7);
        poVar5 = std::operator<<(poVar5,_Var2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
        _Var3 = std::setprecision(2);
        poVar5 = std::operator<<(poVar5,_Var3);
        local_72c = (float)pmVar15->TotalNS;
        local_734 = (float)local_188;
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_72c * 100.0) / local_734);
        poVar5 = std::operator<<(poVar5,"%, ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        _Var2 = std::setw(0xd);
        poVar5 = std::operator<<(poVar5,_Var2);
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,pmVar15->TotalNS / pmVar15->NumberOfCalls);
        poVar5 = std::operator<<(poVar5,", ");
        in_stack_fffffffffffff880 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        in_stack_fffffffffffff87c = std::setw(0xd);
        in_stack_fffffffffffff870 =
             std::operator<<(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
        in_stack_fffffffffffff868 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffff870,pmVar15->MinNS);
        poVar5 = std::operator<<(in_stack_fffffffffffff868,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::right);
        in_stack_fffffffffffff854 = std::setw(0xd);
        in_stack_fffffffffffff848._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar5,in_stack_fffffffffffff854);
        in_stack_fffffffffffff840 =
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>_>
              *)std::ostream::operator<<(in_stack_fffffffffffff848._M_current,pmVar15->MaxNS);
        std::ostream::operator<<(in_stack_fffffffffffff840,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1f8);
      }
      std::
      _Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>
                    *)in_stack_fffffffffffff840);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff854._M_n,in_stack_fffffffffffff850));
    }
  }
  pSVar4 = config(in_RDI);
  if ((pSVar4->DevicePerfCounterEventBasedSampling & 1U) != 0) {
    reportMDAPICounters(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  }
  return;
}

Assistant:

void CLIntercept::writeReport(
    std::ostream& os )
{
    if( config().FinishAfterEnqueue )
    {
        os << "*** WARNING *** FinishAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().FlushAfterEnqueue )
    {
        os << "*** WARNING *** FlushAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().NullEnqueue )
    {
        os << "*** WARNING *** NullEnqueue Enabled!" << std::endl << std::endl;
    }

    os << "Total Enqueues: " << m_EnqueueCounter.load(std::memory_order_relaxed) << std::endl << std::endl;

    if( config().LeakChecking )
    {
        os << std::endl << "Leak Checking:" << std::endl;
        m_ObjectTracker.writeReport( os );
    }

    if( !m_LongKernelNameMap.empty() )
    {
        os << std::endl << "Kernel name mapping:" << std::endl;

        os << std::endl
            << std::right << std::setw(10) << "Short Name" << ", "
            << std::right << std::setw(1) << "Long Name" << std::endl;

        CLongKernelNameMap::const_iterator i = m_LongKernelNameMap.begin();
        while( i != m_LongKernelNameMap.end() )
        {
            os << std::right << std::setw(10) << i->second << ", "
                << std::right << std::setw(1) << i->first << std::endl;

            ++i;
        }
    }

    if( config().HostPerformanceTiming &&
        !m_HostTimingStatsMap.empty() )
    {
        os << std::endl << "Host Performance Timing Results:" << std::endl;

        std::vector<std::string> keys;
        keys.reserve(m_HostTimingStatsMap.size());

        uint64_t    totalTotalNS = 0;
        size_t      longestName = 32;

        CHostTimingStatsMap::const_iterator i = m_HostTimingStatsMap.begin();
        while( i != m_HostTimingStatsMap.end() )
        {
            const std::string& name = (*i).first;
            const SHostTimingStats& hostTimingStats = (*i).second;

            if( !name.empty() )
            {
                keys.push_back(name);
                totalTotalNS += hostTimingStats.TotalNS;
                longestName = std::max< size_t >( name.length(), longestName );
            }

            ++i;
        }

        std::sort(keys.begin(), keys.end());

        os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

        os << std::endl
            << std::right << std::setw(longestName) << "Function Name" << ", "
            << std::right << std::setw( 6) << "Calls" << ", "
            << std::right << std::setw(13) << "Time (ns)" << ", "
            << std::right << std::setw( 8) << "Time (%)" << ", "
            << std::right << std::setw(13) << "Average (ns)" << ", "
            << std::right << std::setw(13) << "Min (ns)" << ", "
            << std::right << std::setw(13) << "Max (ns)" << std::endl;

        for( const auto& name : keys )
        {
            const SHostTimingStats& hostTimingStats = m_HostTimingStatsMap.at(name);

            os << std::right << std::setw(longestName) << name << ", "
                << std::right << std::setw( 6) << hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.TotalNS << ", "
                << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << hostTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                << std::right << std::setw(13) << hostTimingStats.TotalNS / hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.MinNS << ", "
                << std::right << std::setw(13) << hostTimingStats.MaxNS << std::endl;
        }
    }

    if( config().DevicePerformanceTiming &&
        !m_DeviceTimingStatsMap.empty() )
    {
        CDeviceDeviceTimingStatsMap::const_iterator id = m_DeviceTimingStatsMap.begin();
        while( id != m_DeviceTimingStatsMap.end() )
        {
            const cl_device_id  device = (*id).first;
            const CDeviceTimingStatsMap& dtsm = (*id).second;

            const SDeviceInfo&  deviceInfo = m_DeviceInfoMap[device];

            os << std::endl << "Device Performance Timing Results for " << deviceInfo.NameForReport << ":" << std::endl;

            std::vector<std::string> keys;
            keys.reserve(dtsm.size());

            cl_ulong    totalTotalNS = 0;
            size_t      longestName = 32;

            CDeviceTimingStatsMap::const_iterator i = dtsm.begin();
            while( i != dtsm.end() )
            {
                const std::string& name = (*i).first;
                const SDeviceTimingStats& deviceTimingStats = (*i).second;

                if( !name.empty() )
                {
                    keys.push_back(name);
                    totalTotalNS += deviceTimingStats.TotalNS;
                    longestName = std::max< size_t >( name.length(), longestName );
                }

                ++i;
            }

            std::sort(keys.begin(), keys.end());

            os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

            os << std::endl
                << std::right << std::setw(longestName) << "Function Name" << ", "
                << std::right << std::setw( 6) << "Calls" << ", "
                << std::right << std::setw(13) << "Time (ns)" << ", "
                << std::right << std::setw( 8) << "Time (%)" << ", "
                << std::right << std::setw(13) << "Average (ns)" << ", "
                << std::right << std::setw(13) << "Min (ns)" << ", "
                << std::right << std::setw(13) << "Max (ns)" << std::endl;

            for( const auto& name : keys )
            {
                const SDeviceTimingStats& deviceTimingStats = dtsm.at(name);

                os << std::right << std::setw(longestName) << name << ", "
                    << std::right << std::setw( 6) << deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS << ", "
                    << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << deviceTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS / deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MinNS << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MaxNS << std::endl;
            }

            ++id;
        }
    }

#if defined(USE_MDAPI)
    if( config().DevicePerfCounterEventBasedSampling )
    {
        reportMDAPICounters( os );
    }
#endif
}